

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

void armci_msg_gop_scope(int scope,void *x,int n,char *op,int type)

{
  ARMCI_Group group;
  ARMCI_Group local_2c;
  
  if (scope == 0x151) {
    local_2c = -2;
    if (1 < _number_of_procs_per_node) {
      local_2c = ARMCI_Node_group;
    }
  }
  else {
    ARMCI_Group_get_default(&local_2c);
  }
  do_gop(x,n,op,type,local_2c);
  return;
}

Assistant:

void armci_msg_gop_scope(int scope, void *x, int n, char* op, int type)
{
    if (SCOPE_NODE == scope) {
      if (_number_of_procs_per_node > 1) {
        do_gop(x, n, op, type, ARMCI_Node_group);
      } else {
        do_gop(x, n, op, type, ARMCI_GROUP_SELF);
      }
    } else {
        do_gop(x, n, op, type, get_default_group());
    }
}